

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void spr_write_ibatu(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i32 arg2;
  TCGv_i32 t0;
  TCGContext_conflict10 *tcg_ctx;
  int gprn_local;
  int sprn_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  arg2 = tcg_const_i32_ppc64(tcg_ctx_00,(sprn + -0x210) / 2);
  gen_helper_store_ibatu(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,cpu_gpr[gprn]);
  tcg_temp_free_i32(tcg_ctx_00,arg2);
  return;
}

Assistant:

static void spr_write_ibatu(DisasContext *ctx, int sprn, int gprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_const_i32(tcg_ctx, (sprn - SPR_IBAT0U) / 2);
    gen_helper_store_ibatu(tcg_ctx, tcg_ctx->cpu_env, t0, cpu_gpr[gprn]);
    tcg_temp_free_i32(tcg_ctx, t0);
}